

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O2

void __thiscall cpp_sgr::color::color(color *this,ANSIColor code,bool foreground)

{
  undefined3 in_register_00000011;
  string local_30;
  
  if (CONCAT31(in_register_00000011,foreground) == 0) {
    code = code + 10;
  }
  std::__cxx11::to_string(&local_30,code);
  std::__cxx11::string::string((string *)this,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

color(const ANSIColor code, bool foreground) :
			sgr(std::to_string(foreground ? code : (code + 10)))
		{}